

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

shared_ptr<kratos::Stmt> __thiscall
kratos::RemoveEmptyBlockVisitor::dispatch_node
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::Stmt> *stmt)

{
  StatementType SVar1;
  element_type *peVar2;
  __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<kratos::Stmt> sVar4;
  shared_ptr<kratos::ScopedStmtBlock> local_a0;
  shared_ptr<kratos::StmtBlock> local_90;
  undefined1 local_80 [32];
  undefined1 local_60 [48];
  shared_ptr<kratos::Stmt> *stmt_local;
  RemoveEmptyBlockVisitor *this_local;
  
  stmt_local = stmt;
  this_local = this;
  peVar2 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  SVar1 = Stmt::type(peVar2);
  if (SVar1 == If) {
    std::static_pointer_cast<kratos::IfStmt,kratos::Stmt>
              ((shared_ptr<kratos::Stmt> *)(local_60 + 0x20));
    process((RemoveEmptyBlockVisitor *)&stack0xffffffffffffffd0,(shared_ptr<kratos::IfStmt> *)stmt);
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
              ((shared_ptr<kratos::Stmt> *)this,
               (shared_ptr<kratos::IfStmt> *)&stack0xffffffffffffffd0);
    std::shared_ptr<kratos::IfStmt>::~shared_ptr
              ((shared_ptr<kratos::IfStmt> *)&stack0xffffffffffffffd0);
    std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)(local_60 + 0x20));
    _Var3._M_pi = extraout_RDX;
  }
  else {
    peVar2 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    SVar1 = Stmt::type(peVar2);
    if (SVar1 == Switch) {
      std::static_pointer_cast<kratos::SwitchStmt,kratos::Stmt>
                ((shared_ptr<kratos::Stmt> *)(local_80 + 0x10));
      process((RemoveEmptyBlockVisitor *)local_60,(shared_ptr<kratos::SwitchStmt> *)stmt);
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
                ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::SwitchStmt> *)local_60);
      std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_60);
      std::shared_ptr<kratos::SwitchStmt>::~shared_ptr
                ((shared_ptr<kratos::SwitchStmt> *)(local_80 + 0x10));
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      peVar2 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      SVar1 = Stmt::type(peVar2);
      if (SVar1 == Block) {
        std::static_pointer_cast<kratos::ScopedStmtBlock,kratos::Stmt>
                  ((shared_ptr<kratos::Stmt> *)&local_a0);
        std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>
                  (&local_90,&local_a0);
        process((RemoveEmptyBlockVisitor *)local_80,(shared_ptr<kratos::StmtBlock> *)stmt);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::StmtBlock,void>
                  ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::StmtBlock> *)local_80);
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_80);
        std::shared_ptr<kratos::StmtBlock>::~shared_ptr(&local_90);
        std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&local_a0);
        _Var3._M_pi = extraout_RDX_01;
      }
      else {
        std::shared_ptr<kratos::Stmt>::shared_ptr
                  ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::Stmt> *)in_RDX);
        _Var3._M_pi = extraout_RDX_02;
      }
    }
  }
  sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> dispatch_node(std::shared_ptr<Stmt> stmt) {
        if (stmt->type() == StatementType::If) {
            return process(std::static_pointer_cast<IfStmt>(stmt));
        } else if (stmt->type() == StatementType::Switch) {
            return process(std::static_pointer_cast<SwitchStmt>(stmt));
        } else if (stmt->type() == StatementType::Block) {
            return process(std::static_pointer_cast<ScopedStmtBlock>(stmt));
        } else {
            return stmt;
        }
    }